

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O3

uint32_t __thiscall cppnet::BufferBlock::GetCanWriteLength(BufferBlock *this)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = this->_read;
  pcVar2 = this->_write;
  if (pcVar1 < pcVar2) {
    pcVar1 = (char *)(ulong)(uint)((int)pcVar1 + *(int *)&this->_buffer_end);
    pcVar2 = (char *)(ulong)(uint)((int)pcVar2 + *(int *)&this->_buffer_start);
  }
  else if (pcVar1 <= pcVar2) {
    if (this->_can_read != false) {
      return 0;
    }
    return this->_total_size;
  }
  return (int)pcVar1 - (int)pcVar2;
}

Assistant:

uint32_t BufferBlock::GetCanWriteLength() {
    if (_write > _read) {
        return (uint32_t)((_buffer_end - _write) + (_read - _buffer_start));
    
    } else if (_write < _read) {
        return (uint32_t)((_read - _write));

    } else {
        if (_can_read) {
            return 0;
        
        } else {
            return _total_size;
        }
    }
}